

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O0

void __thiscall BBDT<TTA>::FirstScan(BBDT<TTA> *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uchar *puVar8;
  uint *puVar9;
  int local_54;
  int c;
  uint *img_labels_row_prev_prev;
  uint *img_labels_row;
  uchar *img_row_fol;
  uchar *img_row_prev_prev;
  uchar *img_row_prev;
  uchar *img_row;
  int r;
  int w;
  int h;
  BBDT<TTA> *this_local;
  
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  TTA::Setup();
  for (img_row._4_4_ = 0; img_row._4_4_ < iVar1; img_row._4_4_ = img_row._4_4_ + 2) {
    puVar8 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        img_row._4_4_);
    lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    lVar5 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
            lVar3;
    lVar4 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar9 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,img_row._4_4_);
    lVar6 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                         field_0x48 -
            **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (local_54 = 0; local_54 < iVar2; local_54 = local_54 + 2) {
      if (puVar8[local_54] == '\0') {
        if ((img_row._4_4_ + 1 < iVar1) && (puVar8[local_54 + lVar4] != '\0')) {
          if ((local_54 + 1 < iVar2) && (puVar8[local_54 + 1] != '\0')) {
            if ((local_54 + -1 < 0) || (puVar8[local_54 + -1] == '\0')) {
              if ((local_54 + -1 < 0) ||
                 ((iVar1 <= img_row._4_4_ + 1 || (puVar8[(local_54 + -1) + lVar4] == '\0')))) {
                if ((local_54 + 1 < iVar2) &&
                   ((-1 < img_row._4_4_ + -1 && (puVar8[(local_54 + 1) - lVar3] != '\0')))) {
                  puVar9[local_54] = *(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6);
                }
                else if ((local_54 + 2 < iVar2) &&
                        ((-1 < img_row._4_4_ + -1 && (puVar8[(local_54 + 2) - lVar3] != '\0')))) {
                  if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                    puVar9[local_54] = *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6);
                  }
                  else if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -2)) &&
                          (puVar8[(local_54 + 1) + lVar5] != '\0')) {
                    puVar9[local_54] = *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6);
                  }
                  else {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                       *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6));
                    puVar9[local_54] = uVar7;
                  }
                }
                else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                  uVar7 = TTA::NewLabel();
                  puVar9[local_54] = uVar7;
                }
                else {
                  puVar9[local_54] = *(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6);
                }
              }
              else if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -1)) &&
                      (puVar8[(local_54 + 1) - lVar3] != '\0')) {
                if ((local_54 + -2 < 0) || (puVar8[local_54 + -2] == '\0')) {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                     puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
                else if (((local_54 + -1 < 0) || (img_row._4_4_ + -1 < 0)) ||
                        (puVar8[(local_54 + -1) - lVar3] == '\0')) {
                  if (((local_54 + -2 < 0) || (img_row._4_4_ + -1 < 0)) ||
                     (puVar8[(local_54 + -2) - lVar3] == '\0')) {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                       puVar9[local_54 + -2]);
                    puVar9[local_54] = uVar7;
                  }
                  else if (((local_54 + -1 < 0) || (img_row._4_4_ + -2 < 0)) ||
                          (puVar8[(local_54 + -1) + lVar5] == '\0')) {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                       puVar9[local_54 + -2]);
                    puVar9[local_54] = uVar7;
                  }
                  else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                    if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                      uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                         puVar9[local_54 + -2]);
                      puVar9[local_54] = uVar7;
                    }
                    else {
                      puVar9[local_54] = puVar9[local_54 + -2];
                    }
                  }
                  else {
                    puVar9[local_54] = puVar9[local_54 + -2];
                  }
                }
                else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                  if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                       puVar9[local_54 + -2]);
                    puVar9[local_54] = uVar7;
                  }
                  else {
                    puVar9[local_54] = puVar9[local_54 + -2];
                  }
                }
                else {
                  puVar9[local_54] = puVar9[local_54 + -2];
                }
              }
              else if (((local_54 + 2 < iVar2) && (-1 < img_row._4_4_ + -1)) &&
                      (puVar8[(local_54 + 2) - lVar3] != '\0')) {
                if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -2)) &&
                   (puVar8[(local_54 + 1) + lVar5] != '\0')) {
                  if ((local_54 + -2 < 0) || (puVar8[local_54 + -2] == '\0')) {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                       puVar9[local_54 + -2]);
                    puVar9[local_54] = uVar7;
                  }
                  else if (((local_54 + -1 < 0) || (img_row._4_4_ + -1 < 0)) ||
                          (puVar8[(local_54 + -1) - lVar3] == '\0')) {
                    if (((local_54 + -2 < 0) || (img_row._4_4_ + -1 < 0)) ||
                       (puVar8[(local_54 + -2) - lVar3] == '\0')) {
                      uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                         puVar9[local_54 + -2]);
                      puVar9[local_54] = uVar7;
                    }
                    else if (((local_54 + -1 < 0) || (img_row._4_4_ + -2 < 0)) ||
                            (puVar8[(local_54 + -1) + lVar5] == '\0')) {
                      uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                         puVar9[local_54 + -2]);
                      puVar9[local_54] = uVar7;
                    }
                    else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                      if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                        uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6
                                                    ),puVar9[local_54 + -2]);
                        puVar9[local_54] = uVar7;
                      }
                      else {
                        puVar9[local_54] = puVar9[local_54 + -2];
                      }
                    }
                    else {
                      puVar9[local_54] = puVar9[local_54 + -2];
                    }
                  }
                  else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                    if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                      uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                         puVar9[local_54 + -2]);
                      puVar9[local_54] = uVar7;
                    }
                    else {
                      puVar9[local_54] = puVar9[local_54 + -2];
                    }
                  }
                  else {
                    puVar9[local_54] = puVar9[local_54 + -2];
                  }
                }
                else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                     puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
                else if ((local_54 + -2 < 0) || (puVar8[local_54 + -2] == '\0')) {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                     *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6));
                  uVar7 = TTA::Merge(uVar7,puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
                else if (((local_54 + -1 < 0) || (img_row._4_4_ + -1 < 0)) ||
                        (puVar8[(local_54 + -1) - lVar3] == '\0')) {
                  if (((local_54 + -2 < 0) || (img_row._4_4_ + -1 < 0)) ||
                     (puVar8[(local_54 + -2) - lVar3] == '\0')) {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                       *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6));
                    uVar7 = TTA::Merge(uVar7,puVar9[local_54 + -2]);
                    puVar9[local_54] = uVar7;
                  }
                  else if (((local_54 + -1 < 0) || (img_row._4_4_ + -2 < 0)) ||
                          (puVar8[(local_54 + -1) + lVar5] == '\0')) {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                       *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6));
                    uVar7 = TTA::Merge(uVar7,puVar9[local_54 + -2]);
                    puVar9[local_54] = uVar7;
                  }
                  else {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                       puVar9[local_54 + -2]);
                    puVar9[local_54] = uVar7;
                  }
                }
                else {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                     puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
              }
              else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                puVar9[local_54] = puVar9[local_54 + -2];
              }
              else if ((local_54 + -2 < 0) || (puVar8[local_54 + -2] == '\0')) {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                   puVar9[local_54 + -2]);
                puVar9[local_54] = uVar7;
              }
              else if (((local_54 + -1 < 0) || (img_row._4_4_ + -1 < 0)) ||
                      (puVar8[(local_54 + -1) - lVar3] == '\0')) {
                if (((local_54 + -2 < 0) || (img_row._4_4_ + -1 < 0)) ||
                   (puVar8[(local_54 + -2) - lVar3] == '\0')) {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                     puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
                else if (((local_54 + -1 < 0) || (img_row._4_4_ + -2 < 0)) ||
                        (puVar8[(local_54 + -1) + lVar5] == '\0')) {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                     puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
                else {
                  puVar9[local_54] = puVar9[local_54 + -2];
                }
              }
              else {
                puVar9[local_54] = puVar9[local_54 + -2];
              }
            }
            else if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -1)) &&
                    (puVar8[(local_54 + 1) - lVar3] != '\0')) {
              if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                     puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
                else if (((local_54 + -1 < 0) || (img_row._4_4_ + -1 < 0)) ||
                        (puVar8[(local_54 + -1) - lVar3] == '\0')) {
                  if (((local_54 + -2 < 0) || (img_row._4_4_ + -1 < 0)) ||
                     (puVar8[(local_54 + -2) - lVar3] == '\0')) {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                       puVar9[local_54 + -2]);
                    puVar9[local_54] = uVar7;
                  }
                  else if (((local_54 + -1 < 0) || (img_row._4_4_ + -2 < 0)) ||
                          (puVar8[(local_54 + -1) + lVar5] == '\0')) {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                       puVar9[local_54 + -2]);
                    puVar9[local_54] = uVar7;
                  }
                  else {
                    puVar9[local_54] = puVar9[local_54 + -2];
                  }
                }
                else {
                  puVar9[local_54] = puVar9[local_54 + -2];
                }
              }
              else {
                puVar9[local_54] = puVar9[local_54 + -2];
              }
            }
            else if (((local_54 + 2 < iVar2) && (-1 < img_row._4_4_ + -1)) &&
                    (puVar8[(local_54 + 2) - lVar3] != '\0')) {
              if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -2)) &&
                 (puVar8[(local_54 + 1) + lVar5] != '\0')) {
                if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                  if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                       puVar9[local_54 + -2]);
                    puVar9[local_54] = uVar7;
                  }
                  else if (((local_54 + -1 < 0) || (img_row._4_4_ + -1 < 0)) ||
                          (puVar8[(local_54 + -1) - lVar3] == '\0')) {
                    if (((local_54 + -2 < 0) || (img_row._4_4_ + -1 < 0)) ||
                       (puVar8[(local_54 + -2) - lVar3] == '\0')) {
                      uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                         puVar9[local_54 + -2]);
                      puVar9[local_54] = uVar7;
                    }
                    else if (((local_54 + -1 < 0) || (img_row._4_4_ + -2 < 0)) ||
                            (puVar8[(local_54 + -1) + lVar5] == '\0')) {
                      uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                         puVar9[local_54 + -2]);
                      puVar9[local_54] = uVar7;
                    }
                    else {
                      puVar9[local_54] = puVar9[local_54 + -2];
                    }
                  }
                  else {
                    puVar9[local_54] = puVar9[local_54 + -2];
                  }
                }
                else {
                  puVar9[local_54] = puVar9[local_54 + -2];
                }
              }
              else {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                   puVar9[local_54 + -2]);
                puVar9[local_54] = uVar7;
              }
            }
            else {
              puVar9[local_54] = puVar9[local_54 + -2];
            }
          }
          else if ((local_54 + -1 < 0) ||
                  ((iVar1 <= img_row._4_4_ + 1 || (puVar8[(local_54 + -1) + lVar4] == '\0')))) {
            if ((local_54 + -1 < 0) || (puVar8[local_54 + -1] == '\0')) {
              uVar7 = TTA::NewLabel();
              puVar9[local_54] = uVar7;
            }
            else {
              puVar9[local_54] = puVar9[local_54 + -2];
            }
          }
          else {
            puVar9[local_54] = puVar9[local_54 + -2];
          }
        }
        else if ((local_54 + 1 < iVar2) && (puVar8[local_54 + 1] != '\0')) {
          if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -1)) &&
             (puVar8[(local_54 + 1) - lVar3] != '\0')) {
            puVar9[local_54] = *(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6);
          }
          else if (((local_54 + 2 < iVar2) && (-1 < img_row._4_4_ + -1)) &&
                  (puVar8[(local_54 + 2) - lVar3] != '\0')) {
            if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
              puVar9[local_54] = *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6);
            }
            else if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -2)) &&
                    (puVar8[(local_54 + 1) + lVar5] != '\0')) {
              puVar9[local_54] = *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6);
            }
            else {
              uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                 *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6));
              puVar9[local_54] = uVar7;
            }
          }
          else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
            uVar7 = TTA::NewLabel();
            puVar9[local_54] = uVar7;
          }
          else {
            puVar9[local_54] = *(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6);
          }
        }
        else if (((local_54 + 1 < iVar2) && (img_row._4_4_ + 1 < iVar1)) &&
                (puVar8[(local_54 + 1) + lVar4] != '\0')) {
          uVar7 = TTA::NewLabel();
          puVar9[local_54] = uVar7;
        }
        else {
          puVar9[local_54] = 0;
        }
      }
      else if ((local_54 + -1 < 0) || (puVar8[local_54 + -1] == '\0')) {
        if ((local_54 + -1 < 0) ||
           ((iVar1 <= img_row._4_4_ + 1 || (puVar8[(local_54 + -1) + lVar4] == '\0')))) {
          if ((local_54 + 1 < iVar2) &&
             ((-1 < img_row._4_4_ + -1 && (puVar8[(local_54 + 1) - lVar3] != '\0')))) {
            if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
              if ((local_54 + -1 < 0) ||
                 ((img_row._4_4_ + -1 < 0 || (puVar8[(local_54 + -1) - lVar3] == '\0')))) {
                puVar9[local_54] = *(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6);
              }
              else if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + -2) * 4 + lVar6),
                                   *(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6));
                puVar9[local_54] = uVar7;
              }
              else {
                puVar9[local_54] = *(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6);
              }
            }
            else {
              puVar9[local_54] = *(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6);
            }
          }
          else if ((local_54 + 1 < iVar2) && (puVar8[local_54 + 1] != '\0')) {
            if (((local_54 + 2 < iVar2) && (-1 < img_row._4_4_ + -1)) &&
               (puVar8[(local_54 + 2) - lVar3] != '\0')) {
              if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                if ((local_54 + -1 < 0) ||
                   ((img_row._4_4_ + -1 < 0 || (puVar8[(local_54 + -1) - lVar3] == '\0')))) {
                  puVar9[local_54] = *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6);
                }
                else if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -2)) &&
                        (puVar8[(local_54 + 1) + lVar5] != '\0')) {
                  if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + -2) * 4 + lVar6),
                                       *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6));
                    puVar9[local_54] = uVar7;
                  }
                  else {
                    puVar9[local_54] = *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6);
                  }
                }
                else {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + -2) * 4 + lVar6),
                                     *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6));
                  puVar9[local_54] = uVar7;
                }
              }
              else if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -2)) &&
                      (puVar8[(local_54 + 1) + lVar5] != '\0')) {
                puVar9[local_54] = *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6);
              }
              else {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                   *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6));
                puVar9[local_54] = uVar7;
              }
            }
            else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
              if ((local_54 + -1 < 0) ||
                 ((img_row._4_4_ + -1 < 0 || (puVar8[(local_54 + -1) - lVar3] == '\0')))) {
                uVar7 = TTA::NewLabel();
                puVar9[local_54] = uVar7;
              }
              else {
                puVar9[local_54] = *(uint *)((long)puVar9 + (long)(local_54 + -2) * 4 + lVar6);
              }
            }
            else {
              puVar9[local_54] = *(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6);
            }
          }
          else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
            if ((local_54 + -1 < 0) ||
               ((img_row._4_4_ + -1 < 0 || (puVar8[(local_54 + -1) - lVar3] == '\0')))) {
              uVar7 = TTA::NewLabel();
              puVar9[local_54] = uVar7;
            }
            else {
              puVar9[local_54] = *(uint *)((long)puVar9 + (long)(local_54 + -2) * 4 + lVar6);
            }
          }
          else {
            puVar9[local_54] = *(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6);
          }
        }
        else if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -1)) &&
                (puVar8[(local_54 + 1) - lVar3] != '\0')) {
          if ((local_54 + -2 < 0) || (puVar8[local_54 + -2] == '\0')) {
            if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
              if (((local_54 + -1 < 0) || (img_row._4_4_ + -1 < 0)) ||
                 (puVar8[(local_54 + -1) - lVar3] == '\0')) {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                   puVar9[local_54 + -2]);
                puVar9[local_54] = uVar7;
              }
              else if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + -2) * 4 + lVar6),
                                   *(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6));
                uVar7 = TTA::Merge(uVar7,puVar9[local_54 + -2]);
                puVar9[local_54] = uVar7;
              }
              else {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                   puVar9[local_54 + -2]);
                puVar9[local_54] = uVar7;
              }
            }
            else {
              uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                 puVar9[local_54 + -2]);
              puVar9[local_54] = uVar7;
            }
          }
          else if (((local_54 + -1 < 0) || (img_row._4_4_ + -1 < 0)) ||
                  (puVar8[(local_54 + -1) - lVar3] == '\0')) {
            if (((local_54 + -2 < 0) || (img_row._4_4_ + -1 < 0)) ||
               (puVar8[(local_54 + -2) - lVar3] == '\0')) {
              uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                 puVar9[local_54 + -2]);
              puVar9[local_54] = uVar7;
            }
            else if (((local_54 + -1 < 0) || (img_row._4_4_ + -2 < 0)) ||
                    (puVar8[(local_54 + -1) + lVar5] == '\0')) {
              uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                 puVar9[local_54 + -2]);
              puVar9[local_54] = uVar7;
            }
            else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
              if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                   puVar9[local_54 + -2]);
                puVar9[local_54] = uVar7;
              }
              else {
                puVar9[local_54] = puVar9[local_54 + -2];
              }
            }
            else {
              puVar9[local_54] = puVar9[local_54 + -2];
            }
          }
          else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
            if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
              uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                 puVar9[local_54 + -2]);
              puVar9[local_54] = uVar7;
            }
            else {
              puVar9[local_54] = puVar9[local_54 + -2];
            }
          }
          else {
            puVar9[local_54] = puVar9[local_54 + -2];
          }
        }
        else if ((local_54 + 1 < iVar2) && (puVar8[local_54 + 1] != '\0')) {
          if (((local_54 + 2 < iVar2) && (-1 < img_row._4_4_ + -1)) &&
             (puVar8[(local_54 + 2) - lVar3] != '\0')) {
            if ((local_54 + -2 < 0) || (puVar8[local_54 + -2] == '\0')) {
              if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                if (((local_54 + -1 < 0) || (img_row._4_4_ + -1 < 0)) ||
                   (puVar8[(local_54 + -1) - lVar3] == '\0')) {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                     puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
                else if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -2)) &&
                        (puVar8[(local_54 + 1) + lVar5] != '\0')) {
                  if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + -2) * 4 + lVar6),
                                       *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6));
                    uVar7 = TTA::Merge(uVar7,puVar9[local_54 + -2]);
                    puVar9[local_54] = uVar7;
                  }
                  else {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                       puVar9[local_54 + -2]);
                    puVar9[local_54] = uVar7;
                  }
                }
                else {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + -2) * 4 + lVar6),
                                     *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6));
                  uVar7 = TTA::Merge(uVar7,puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
              }
              else if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -2)) &&
                      (puVar8[(local_54 + 1) + lVar5] != '\0')) {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                   puVar9[local_54 + -2]);
                puVar9[local_54] = uVar7;
              }
              else {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                   *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6));
                uVar7 = TTA::Merge(uVar7,puVar9[local_54 + -2]);
                puVar9[local_54] = uVar7;
              }
            }
            else if (((local_54 + -1 < 0) || (img_row._4_4_ + -1 < 0)) ||
                    (puVar8[(local_54 + -1) - lVar3] == '\0')) {
              if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -2)) &&
                 (puVar8[(local_54 + 1) + lVar5] != '\0')) {
                if (((local_54 + -2 < 0) || (img_row._4_4_ + -1 < 0)) ||
                   (puVar8[(local_54 + -2) - lVar3] == '\0')) {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                     puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
                else if (((local_54 + -1 < 0) || (img_row._4_4_ + -2 < 0)) ||
                        (puVar8[(local_54 + -1) + lVar5] == '\0')) {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                     puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
                else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                  if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                    uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                       puVar9[local_54 + -2]);
                    puVar9[local_54] = uVar7;
                  }
                  else {
                    puVar9[local_54] = puVar9[local_54 + -2];
                  }
                }
                else {
                  puVar9[local_54] = puVar9[local_54 + -2];
                }
              }
              else if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                   puVar9[local_54 + -2]);
                puVar9[local_54] = uVar7;
              }
              else if (((local_54 + -2 < 0) || (img_row._4_4_ + -1 < 0)) ||
                      (puVar8[(local_54 + -2) - lVar3] == '\0')) {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                   *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6));
                uVar7 = TTA::Merge(uVar7,puVar9[local_54 + -2]);
                puVar9[local_54] = uVar7;
              }
              else if (((local_54 + -1 < 0) || (img_row._4_4_ + -2 < 0)) ||
                      (puVar8[(local_54 + -1) + lVar5] == '\0')) {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                   *(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6));
                uVar7 = TTA::Merge(uVar7,puVar9[local_54 + -2]);
                puVar9[local_54] = uVar7;
              }
              else {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                   puVar9[local_54 + -2]);
                puVar9[local_54] = uVar7;
              }
            }
            else if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -2)) &&
                    (puVar8[(local_54 + 1) + lVar5] != '\0')) {
              if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
                if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                     puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
                else {
                  puVar9[local_54] = puVar9[local_54 + -2];
                }
              }
              else {
                puVar9[local_54] = puVar9[local_54 + -2];
              }
            }
            else {
              uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                 puVar9[local_54 + -2]);
              puVar9[local_54] = uVar7;
            }
          }
          else if (((local_54 + -1 < 0) || (img_row._4_4_ + -1 < 0)) ||
                  (puVar8[(local_54 + -1) - lVar3] == '\0')) {
            if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
              puVar9[local_54] = puVar9[local_54 + -2];
            }
            else if ((local_54 + -2 < 0) || (puVar8[local_54 + -2] == '\0')) {
              uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                 puVar9[local_54 + -2]);
              puVar9[local_54] = uVar7;
            }
            else if (((local_54 + -2 < 0) || (img_row._4_4_ + -1 < 0)) ||
                    (puVar8[(local_54 + -2) - lVar3] == '\0')) {
              uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                 puVar9[local_54 + -2]);
              puVar9[local_54] = uVar7;
            }
            else if (((local_54 + -1 < 0) || (img_row._4_4_ + -2 < 0)) ||
                    (puVar8[(local_54 + -1) + lVar5] == '\0')) {
              uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                 puVar9[local_54 + -2]);
              puVar9[local_54] = uVar7;
            }
            else {
              puVar9[local_54] = puVar9[local_54 + -2];
            }
          }
          else if ((local_54 + -2 < 0) || (puVar8[local_54 + -2] == '\0')) {
            uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + -2) * 4 + lVar6),
                               puVar9[local_54 + -2]);
            puVar9[local_54] = uVar7;
          }
          else {
            puVar9[local_54] = puVar9[local_54 + -2];
          }
        }
        else if ((local_54 + -1 < 0) ||
                ((img_row._4_4_ + -1 < 0 || (puVar8[(local_54 + -1) - lVar3] == '\0')))) {
          if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
            puVar9[local_54] = puVar9[local_54 + -2];
          }
          else if ((local_54 + -2 < 0) || (puVar8[local_54 + -2] == '\0')) {
            uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                               puVar9[local_54 + -2]);
            puVar9[local_54] = uVar7;
          }
          else if (((local_54 + -2 < 0) || (img_row._4_4_ + -1 < 0)) ||
                  (puVar8[(local_54 + -2) - lVar3] == '\0')) {
            uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                               puVar9[local_54 + -2]);
            puVar9[local_54] = uVar7;
          }
          else if (((local_54 + -1 < 0) || (img_row._4_4_ + -2 < 0)) ||
                  (puVar8[(local_54 + -1) + lVar5] == '\0')) {
            uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                               puVar9[local_54 + -2]);
            puVar9[local_54] = uVar7;
          }
          else {
            puVar9[local_54] = puVar9[local_54 + -2];
          }
        }
        else if ((local_54 + -2 < 0) || (puVar8[local_54 + -2] == '\0')) {
          uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + -2) * 4 + lVar6),
                             puVar9[local_54 + -2]);
          puVar9[local_54] = uVar7;
        }
        else {
          puVar9[local_54] = puVar9[local_54 + -2];
        }
      }
      else if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -1)) &&
              (puVar8[(local_54 + 1) - lVar3] != '\0')) {
        if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
          if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
            uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                               puVar9[local_54 + -2]);
            puVar9[local_54] = uVar7;
          }
          else if (((local_54 + -1 < 0) || (img_row._4_4_ + -1 < 0)) ||
                  (puVar8[(local_54 + -1) - lVar3] == '\0')) {
            if (((local_54 + -2 < 0) || (img_row._4_4_ + -1 < 0)) ||
               (puVar8[(local_54 + -2) - lVar3] == '\0')) {
              uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                 puVar9[local_54 + -2]);
              puVar9[local_54] = uVar7;
            }
            else if (((local_54 + -1 < 0) || (img_row._4_4_ + -2 < 0)) ||
                    (puVar8[(local_54 + -1) + lVar5] == '\0')) {
              uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)local_54 * 4 + lVar6),
                                 puVar9[local_54 + -2]);
              puVar9[local_54] = uVar7;
            }
            else {
              puVar9[local_54] = puVar9[local_54 + -2];
            }
          }
          else {
            puVar9[local_54] = puVar9[local_54 + -2];
          }
        }
        else {
          puVar9[local_54] = puVar9[local_54 + -2];
        }
      }
      else if ((local_54 + 1 < iVar2) && (puVar8[local_54 + 1] != '\0')) {
        if (((local_54 + 2 < iVar2) && (-1 < img_row._4_4_ + -1)) &&
           (puVar8[(local_54 + 2) - lVar3] != '\0')) {
          if (((local_54 + 1 < iVar2) && (-1 < img_row._4_4_ + -2)) &&
             (puVar8[(local_54 + 1) + lVar5] != '\0')) {
            if ((img_row._4_4_ + -1 < 0) || (puVar8[local_54 - lVar3] == '\0')) {
              if ((img_row._4_4_ + -2 < 0) || (puVar8[local_54 + lVar5] == '\0')) {
                uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                   puVar9[local_54 + -2]);
                puVar9[local_54] = uVar7;
              }
              else if (((local_54 + -1 < 0) || (img_row._4_4_ + -1 < 0)) ||
                      (puVar8[(local_54 + -1) - lVar3] == '\0')) {
                if (((local_54 + -2 < 0) || (img_row._4_4_ + -1 < 0)) ||
                   (puVar8[(local_54 + -2) - lVar3] == '\0')) {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                     puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
                else if (((local_54 + -1 < 0) || (img_row._4_4_ + -2 < 0)) ||
                        (puVar8[(local_54 + -1) + lVar5] == '\0')) {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                                     puVar9[local_54 + -2]);
                  puVar9[local_54] = uVar7;
                }
                else {
                  puVar9[local_54] = puVar9[local_54 + -2];
                }
              }
              else {
                puVar9[local_54] = puVar9[local_54 + -2];
              }
            }
            else {
              puVar9[local_54] = puVar9[local_54 + -2];
            }
          }
          else {
            uVar7 = TTA::Merge(*(uint *)((long)puVar9 + (long)(local_54 + 2) * 4 + lVar6),
                               puVar9[local_54 + -2]);
            puVar9[local_54] = uVar7;
          }
        }
        else {
          puVar9[local_54] = puVar9[local_54 + -2];
        }
      }
      else {
        puVar9[local_54] = puVar9[local_54 + -2];
      }
    }
  }
  return;
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::Setup(); // Labels solver initialization

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only matter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }